

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

void start_output_pass(j_decompress_ptr cinfo)

{
  jpeg_d_coef_controller *pjVar1;
  JQUANT_TBL *pJVar2;
  int (*paiVar3) [64];
  bool bVar4;
  _func_int_j_decompress_ptr_JSAMPIMAGE *p_Var5;
  code *pcVar6;
  jpeg_component_info *pjVar7;
  _func_int_j_decompress_ptr_JSAMPIMAGE *p_Var8;
  undefined4 uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  my_coef_ptr_conflict1 coef;
  long lVar13;
  
  pjVar1 = cinfo->coef;
  if (pjVar1->coef_arrays == (jvirt_barray_ptr *)0x0) goto LAB_0011d174;
  if (((cinfo->do_block_smoothing == 0) || (cinfo->progressive_mode == 0)) ||
     (cinfo->coef_bits == (int (*) [64])0x0)) {
LAB_0011d169:
    pcVar6 = decompress_data;
  }
  else {
    if (pjVar1[5].decompress_data == (_func_int_j_decompress_ptr_JSAMPIMAGE *)0x0) {
      p_Var5 = (_func_int_j_decompress_ptr_JSAMPIMAGE *)
               (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components * 0x50);
      pjVar1[5].decompress_data = p_Var5;
    }
    uVar12 = (ulong)(uint)cinfo->num_components;
    if (cinfo->num_components < 1) goto LAB_0011d169;
    pjVar7 = cinfo->comp_info;
    p_Var8 = pjVar1[5].decompress_data;
    p_Var5 = p_Var8 + uVar12 * 0x28;
    lVar10 = 0;
    lVar11 = 4;
    bVar4 = false;
    do {
      pJVar2 = pjVar7->quant_table;
      if (((((pJVar2 == (JQUANT_TBL *)0x0) || (pJVar2->quantval[0] == 0)) ||
           ((pJVar2->quantval[1] == 0 ||
            ((pJVar2->quantval[8] == 0 || (pJVar2->quantval[0x10] == 0)))))) ||
          (pJVar2->quantval[9] == 0)) ||
         ((((pJVar2->quantval[2] == 0 || (pJVar2->quantval[3] == 0)) || (pJVar2->quantval[10] == 0))
          || ((pJVar2->quantval[0x11] == 0 || (pJVar2->quantval[0x18] == 0)))))) {
LAB_0011d15a:
        bVar4 = false;
        break;
      }
      paiVar3 = cinfo->coef_bits;
      if (paiVar3[lVar10][0] < 0) goto LAB_0011d15a;
      *(int *)p_Var8 = paiVar3[lVar10][0];
      lVar13 = 0;
      do {
        uVar9 = 0xffffffff;
        if (1 < cinfo->input_scan_number) {
          uVar9 = *(undefined4 *)((long)paiVar3[(int)uVar12 + (int)lVar10] + lVar13 + 4);
        }
        *(undefined4 *)(p_Var5 + lVar13 + 4) = uVar9;
        *(undefined4 *)(p_Var8 + lVar13 + 4) = *(undefined4 *)((long)*paiVar3 + lVar13 + lVar11);
        if (*(int *)((long)*paiVar3 + lVar13 + lVar11) != 0) {
          bVar4 = true;
        }
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0x24);
      p_Var8 = p_Var8 + 0x28;
      p_Var5 = p_Var5 + 0x28;
      lVar10 = lVar10 + 1;
      pjVar7 = pjVar7 + 1;
      uVar12 = (ulong)cinfo->num_components;
      lVar11 = lVar11 + 0x100;
    } while (lVar10 < (long)uVar12);
    if (!bVar4) goto LAB_0011d169;
    pcVar6 = decompress_smooth_data;
  }
  pjVar1->decompress_data = pcVar6;
LAB_0011d174:
  cinfo->output_iMCU_row = 0;
  return;
}

Assistant:

METHODDEF(void)
start_output_pass(j_decompress_ptr cinfo)
{
#ifdef BLOCK_SMOOTHING_SUPPORTED
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;

  /* If multipass, check to see whether to use block smoothing on this pass */
  if (coef->pub.coef_arrays != NULL) {
    if (cinfo->do_block_smoothing && smoothing_ok(cinfo))
      coef->pub.decompress_data = decompress_smooth_data;
    else
      coef->pub.decompress_data = decompress_data;
  }
#endif
  cinfo->output_iMCU_row = 0;
}